

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

set_value set_get(set s,set_key key)

{
  comparable_callback compare_cb;
  pair ppVar1;
  bucket in_RSI;
  long in_RDI;
  pair p;
  bucket b;
  size_t index;
  set_hash hash;
  
  if ((in_RDI != 0) && (in_RSI != (bucket)0x0)) {
    compare_cb = (comparable_callback)(**(code **)(in_RDI + 0x20))(in_RSI);
    ppVar1 = bucket_get_pair(in_RSI,compare_cb,(void *)((ulong)compare_cb % *(ulong *)(in_RDI + 8)))
    ;
    if (ppVar1 != (pair)0x0) {
      return ppVar1->value;
    }
  }
  return (set_value)0x0;
}

Assistant:

set_value set_get(set s, set_key key)
{
	if (s != NULL && key != NULL)
	{
		set_hash hash = s->hash_cb(key);

		size_t index = hash % s->capacity;

		bucket b = &s->buckets[index];

		pair p = bucket_get_pair(b, s->compare_cb, key);

		if (p != NULL)
		{
			return p->value;
		}
	}

	return NULL;
}